

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O2

bool __thiscall
draco::
MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
::GenerateSequenceInternal
          (MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
           *this)

{
  MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *this_00;
  CornerTable *pCVar1;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *this_01;
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  const_reference pvVar5;
  uint uVar6;
  CornerIndex corner_id;
  int iVar7;
  ulong __n;
  bool bVar8;
  
  this_00 = &this->traverser_;
  pCVar1 = (this->traverser_).
           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           .corner_table_;
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::reserve((this->super_PointsSequencer).out_point_ids_,
            (long)(int)((ulong)((long)(pCVar1->vertex_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar1->vertex_corners_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2));
  MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::OnTraversalStart(this_00);
  if (this->corner_order_ ==
      (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       *)0x0) {
    pCVar1 = (this->traverser_).
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             .corner_table_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(pCVar1->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar1->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2;
    iVar7 = SUB164(auVar2 / ZEXT816(3),0);
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    iVar7 = iVar7 + 1;
    corner_id.value_ = 0;
    do {
      iVar7 = iVar7 + -1;
      bVar8 = iVar7 == 0;
      if (bVar8) {
        return bVar8;
      }
      bVar3 = MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ::TraverseFromCorner(this_00,corner_id);
      corner_id.value_ = corner_id.value_ + 3;
    } while (bVar3);
  }
  else {
    uVar6 = 0;
    do {
      __n = (ulong)uVar6;
      this_01 = this->corner_order_;
      uVar4 = (long)(this_01->
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(this_01->
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 2;
      bVar8 = uVar4 <= __n;
      if (uVar4 <= __n) {
        return bVar8;
      }
      pvVar5 = std::
               vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ::at(this_01,__n);
      bVar3 = MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ::TraverseFromCorner(this_00,(CornerIndex)pvVar5->value_);
      uVar6 = uVar6 + 1;
    } while (bVar3);
  }
  return bVar8;
}

Assistant:

bool GenerateSequenceInternal() override {
    // Preallocate memory for storing point indices. We expect the number of
    // points to be the same as the number of corner table vertices.
    out_point_ids()->reserve(traverser_.corner_table()->num_vertices());

    traverser_.OnTraversalStart();
    if (corner_order_) {
      for (uint32_t i = 0; i < corner_order_->size(); ++i) {
        if (!ProcessCorner(corner_order_->at(i))) {
          return false;
        }
      }
    } else {
      const int32_t num_faces = traverser_.corner_table()->num_faces();
      for (int i = 0; i < num_faces; ++i) {
        if (!ProcessCorner(CornerIndex(3 * i))) {
          return false;
        }
      }
    }
    traverser_.OnTraversalEnd();
    return true;
  }